

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O1

void av1_first_pass(AV1_COMP *cpi,int64_t ts_duration)

{
  AV1_COMMON *cm_00;
  ThreadData_conflict *td;
  MACROBLOCKD *xd;
  uint8_t uVar1;
  uint8_t uVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  SequenceHeader *pSVar6;
  FRAME_STATS *mb_stats;
  MB_MODE_INFO **ppMVar7;
  TX_TYPE *pTVar8;
  TileDataEnc *pTVar9;
  AV1_PRIMARY *pAVar10;
  FIRSTPASS_STATS *pFVar11;
  RefCntBuffer *pRVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  double dVar15;
  int iVar16;
  long lVar17;
  RefCntBuffer *pRVar18;
  long lVar19;
  int *piVar20;
  uint uVar21;
  byte bVar22;
  int iVar23;
  scale_factors *psVar24;
  ulong uVar25;
  int iVar26;
  YV12_BUFFER_CONFIG *src;
  long lVar27;
  BLOCK_SIZE bsize;
  int unit_height;
  int iVar28;
  bool bVar29;
  bool bVar30;
  double dVar31;
  double dVar32;
  AV1_COMMON *cm;
  int unit_height_log2;
  int width_mi_log2;
  YV12_BUFFER_CONFIG *local_130;
  long local_f0;
  undefined1 local_a8 [120];
  
  pSVar6 = (cpi->common).seq_params;
  uVar1 = pSVar6->monochrome;
  iVar16 = av1_find_qindex(10.0,pSVar6->bit_depth,0,0xff);
  iVar4 = cpi->ref_frame_flags;
  cpi->ref_frame_flags = 9;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    (cpi->td).mb.e_mbd.cur_buf = cpi->source;
    av1_set_screen_content_options(cpi,&(cpi->common).features);
  }
  av1_set_speed_features_framesize_independent(cpi,(cpi->oxcf).speed);
  bVar29 = cpi->is_screen_content_type == 0;
  bsize = bVar29 * '\x03' + BLOCK_8X8;
  iVar26 = (cpi->oxcf).frm_dim_cfg.forced_max_frame_width;
  iVar28 = (cpi->oxcf).frm_dim_cfg.forced_max_frame_height;
  if (iVar26 == 0) {
    iVar26 = (cpi->common).mi_params.mb_cols;
  }
  else {
    iVar26 = (iVar26 + 7 >> 2) + 2 >> 2;
  }
  cm_00 = &cpi->common;
  if (iVar28 == 0) {
    iVar28 = (cpi->common).mi_params.mb_rows;
  }
  else {
    iVar28 = (iVar28 + 7 >> 2) + 2 >> 2;
  }
  lVar27 = (ulong)bVar29 * 3;
  bVar22 = ""[lVar27 + 3];
  iVar23 = iVar28 << (2 - bVar22 & 0x1f);
  if ((char)(1L << bsize) < '\0') {
    iVar23 = iVar28 >> (bVar22 - 2 & 0x1f);
  }
  uVar2 = ""[lVar27 + 3];
  bVar13 = 2 - uVar2 & 0x1f;
  iVar26 = iVar26 << bVar13;
  cpi->fp_block_size = bsize;
  setup_firstpass_data(cm_00,&cpi->firstpass_data,iVar23,iVar26);
  piVar20 = (cpi->firstpass_data).raw_motion_err_list;
  mb_stats = (cpi->firstpass_data).mb_stats;
  if (cpi->allocated_tiles < (cpi->common).tiles.rows * (cpi->common).tiles.cols) {
    av1_alloc_tile_data(cpi);
  }
  td = &cpi->td;
  iVar28 = (uint)(uVar1 == '\0') * 2 + 1;
  xd = &(cpi->td).mb.e_mbd;
  av1_init_tile_data(cpi);
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    bVar29 = true;
    local_130 = (YV12_BUFFER_CONFIG *)0x0;
  }
  else {
    av1_scale_references(cpi,EIGHTTAP_REGULAR,0,0);
    iVar5 = (cpi->common).remapped_ref_idx[0];
    lVar17 = (long)iVar5;
    psVar24 = (scale_factors *)(ulong)(uint)(0 << bVar13);
    if (lVar17 != -1) {
      psVar24 = (cpi->common).ref_scale_factors + lVar17;
    }
    if (((psVar24->x_scale_fp == -1) || (psVar24->y_scale_fp == -1)) ||
       (psVar24->y_scale_fp == 0x4000 && psVar24->x_scale_fp == 0x4000)) {
      if (iVar5 == -1) {
        pRVar18 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar18 = (cpi->common).ref_frame_map[lVar17];
      }
      local_130 = &pRVar18->buf;
      if (pRVar18 == (RefCntBuffer *)0x0) {
        local_130 = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
    else {
      local_130 = av1_get_scaled_ref_frame(cpi,1);
    }
    iVar5 = (cpi->common).remapped_ref_idx[3];
    lVar17 = (long)iVar5;
    psVar24 = (scale_factors *)0x0;
    if (lVar17 != -1) {
      psVar24 = (cpi->common).ref_scale_factors + lVar17;
    }
    if (((psVar24->x_scale_fp == -1) || (psVar24->y_scale_fp == -1)) ||
       (psVar24->y_scale_fp == 0x4000 && psVar24->x_scale_fp == 0x4000)) {
      if (iVar5 == -1) {
        pRVar18 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar18 = (cpi->common).ref_frame_map[lVar17];
      }
    }
    else {
      pRVar18 = (RefCntBuffer *)av1_get_scaled_ref_frame(cpi,4);
    }
    bVar29 = pRVar18 == (RefCntBuffer *)0x0;
  }
  src = &((cpi->common).cur_frame)->buf;
  av1_setup_frame_size(cpi);
  av1_set_mv_search_params(cpi);
  iVar5 = (cpi->common).mi_params.mi_stride;
  *(cpi->common).mi_params.mi_grid_base = (cpi->common).mi_params.mi_alloc;
  ppMVar7 = (cpi->common).mi_params.mi_grid_base;
  pTVar8 = (cpi->common).mi_params.tx_type_map;
  (cpi->td).mb.e_mbd.mi = ppMVar7;
  (cpi->td).mb.e_mbd.tx_type_map = pTVar8;
  (cpi->td).mb.e_mbd.tx_type_map_stride = iVar5;
  (*ppMVar7)->bsize = bsize;
  (cpi->rc).frames_to_key = 0x7fffffff;
  av1_set_quantizer(cm_00,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,iVar16,
                    (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                    (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                    (cpi->oxcf).tune_cfg.tuning);
  av1_setup_block_planes(xd,pSVar6->subsampling_x,pSVar6->subsampling_y,iVar28);
  av1_setup_src_planes(&td->mb,cpi->source,0,0,iVar28,bsize);
  av1_setup_dst_planes((cpi->td).mb.e_mbd.plane,pSVar6->sb_size,src,0,0,0,iVar28);
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    av1_setup_pre_planes(xd,0,local_130,0,0,(scale_factors *)0x0,iVar28);
  }
  iVar16 = (cpi->common).mi_params.mi_stride;
  *(cpi->common).mi_params.mi_grid_base = (cpi->common).mi_params.mi_alloc;
  pTVar8 = (cpi->common).mi_params.tx_type_map;
  (cpi->td).mb.e_mbd.mi = (cpi->common).mi_params.mi_grid_base;
  (cpi->td).mb.e_mbd.tx_type_map = pTVar8;
  (cpi->td).mb.e_mbd.tx_type_map_stride = iVar16;
  (cpi->td).mb.e_mbd.cfl.store_y = 0;
  av1_frame_init_quantizer(cpi);
  av1_default_coef_probs(cm_00);
  av1_init_mode_probs((cpi->common).fc);
  av1_init_mv_probs(cm_00);
  av1_initialize_rd_consts(cpi);
  (cpi->mt_info).enc_row_mt.sync_read_ptr = av1_row_mt_sync_read_dummy;
  (cpi->mt_info).enc_row_mt.sync_write_ptr = av1_row_mt_sync_write_dummy;
  if ((cpi->mt_info).num_workers < 2) {
    uVar21 = (cpi->common).tiles.cols;
    lVar17 = (long)(cpi->common).tiles.rows;
    av1_alloc_src_diff_buf(cm_00,&td->mb);
    if (0 < lVar17) {
      local_f0 = 0;
      do {
        if (0 < (int)uVar21) {
          lVar19 = local_f0 * (ulong)uVar21;
          bVar13 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [lVar27 + 3];
          uVar25 = 0;
          do {
            pTVar9 = cpi->tile_data;
            iVar16 = pTVar9[uVar25 + lVar19].tile_info.mi_row_start;
            if (iVar16 < pTVar9[uVar25 + lVar19].tile_info.mi_row_end) {
              do {
                av1_first_pass_row(cpi,td,pTVar9 + uVar25 + lVar19,iVar16 >> (bVar22 & 0x1f),bsize);
                iVar16 = iVar16 + (uint)bVar13;
              } while (iVar16 < pTVar9[uVar25 + lVar19].tile_info.mi_row_end);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar21);
        }
        local_f0 = local_f0 + 1;
      } while (local_f0 != lVar17);
    }
  }
  else {
    (cpi->mt_info).enc_row_mt.sync_read_ptr = av1_row_mt_sync_read;
    (cpi->mt_info).enc_row_mt.sync_write_ptr = av1_row_mt_sync_write;
    av1_fp_encode_tiles_row_mt(cpi);
  }
  accumulate_frame_stats((FRAME_STATS *)local_a8,mb_stats,iVar23,iVar26);
  dVar15 = 0.0;
  if (((cm_00->current_frame).frame_type & 0xfd) != 0) {
    uVar21 = iVar23 * iVar26;
    if (uVar21 != 0) {
      dVar31 = 0.0;
      if (0 < (int)uVar21) {
        uVar25 = 0;
        lVar27 = 0;
        do {
          lVar27 = lVar27 + piVar20[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar21 != uVar25);
        dVar31 = (double)lVar27;
      }
      if (0 < (int)uVar21) {
        dVar15 = 0.0;
        uVar25 = 0;
        do {
          dVar32 = (double)piVar20[uVar25] - dVar31 / (double)(int)uVar21;
          dVar15 = dVar15 + dVar32 * dVar32;
          uVar25 = uVar25 + 1;
        } while (uVar21 != uVar25);
      }
      dVar15 = dVar15 / (double)(int)uVar21;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
    }
  }
  aom_free((cpi->firstpass_data).raw_motion_err_list);
  (cpi->firstpass_data).raw_motion_err_list = (int *)0x0;
  aom_free((cpi->firstpass_data).mb_stats);
  (cpi->firstpass_data).mb_stats = (FRAME_STATS *)0x0;
  av1_dealloc_src_diff_buf(&td->mb,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  iVar23 = iVar23 / 2;
  iVar16 = iVar23;
  if ((int)local_a8._60_4_ < iVar23) {
    iVar16 = local_a8._60_4_;
  }
  bVar30 = local_a8._60_4_ == -1;
  local_a8._60_4_ = iVar16;
  if (bVar30) {
    local_a8._60_4_ = iVar23;
  }
  if (0 < (int)local_a8._60_4_) {
    iVar16 = local_a8._56_4_ + iVar26 * local_a8._60_4_ * -2;
    local_a8._56_4_ = 0;
    if (0 < iVar16) {
      local_a8._56_4_ = iVar16;
    }
  }
  piVar20 = &cpi->initial_mbs;
  if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
    piVar20 = &(cpi->common).mi_params.MBs;
  }
  pAVar10 = cpi->ppi;
  dVar31 = (double)(*piVar20 << (4 - (bVar22 + uVar2) & 0x1f));
  auVar14._8_4_ = SUB84(dVar31,0);
  auVar14._0_8_ = dVar31;
  auVar14._12_4_ = (int)((ulong)dVar31 >> 0x20);
  local_a8._104_16_ = divpd(local_a8._104_16_,auVar14);
  pFVar11 = ((pAVar10->twopass).stats_buf_ctx)->stats_in_end;
  update_firstpass_stats
            (cpi,(FRAME_STATS *)local_a8,dVar15,(cpi->common).current_frame.frame_number,ts_duration
             ,bsize);
  iVar16 = (pAVar10->twopass).sr_update_lag;
  if ((3 < iVar16) ||
     ((((cpi->common).current_frame.frame_number != 0 && (0.2 < pFVar11->pcnt_inter)) &&
      (2.0 < pFVar11->intra_error /
             (pFVar11->coded_error +
             *(double *)(&DAT_004e4db0 + (ulong)(pFVar11->coded_error < 0.0) * 8)))))) {
    iVar16 = 1;
    if (!bVar29) {
      iVar26 = (cpi->common).remapped_ref_idx[3];
      pRVar18 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[0]];
      pRVar12 = (cpi->common).ref_frame_map[iVar26];
      if (pRVar12 != (RefCntBuffer *)0x0) {
        pRVar12->ref_count = pRVar12->ref_count + -1;
      }
      (cpi->common).ref_frame_map[iVar26] = pRVar18;
      pRVar18->ref_count = pRVar18->ref_count + 1;
    }
  }
  else {
    iVar16 = iVar16 + 1;
  }
  (pAVar10->twopass).sr_update_lag = iVar16;
  aom_extend_frame_borders_c(src,iVar28);
  iVar16 = (cpi->common).remapped_ref_idx[0];
  pRVar18 = (cpi->common).cur_frame;
  pRVar12 = (cpi->common).ref_frame_map[iVar16];
  if (pRVar12 != (RefCntBuffer *)0x0) {
    pRVar12->ref_count = pRVar12->ref_count + -1;
  }
  (cpi->common).ref_frame_map[iVar16] = pRVar18;
  pRVar18->ref_count = pRVar18->ref_count + 1;
  uVar21 = (cpi->common).current_frame.frame_number;
  if ((uVar21 == 0) && (lVar27 = (long)(cpi->common).remapped_ref_idx[3], lVar27 != -1)) {
    pRVar18 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[0]];
    pRVar12 = (cpi->common).ref_frame_map[lVar27];
    if (pRVar12 != (RefCntBuffer *)0x0) {
      pRVar12->ref_count = pRVar12->ref_count + -1;
    }
    (cpi->common).ref_frame_map[lVar27] = pRVar18;
    pRVar18->ref_count = pRVar18->ref_count + 1;
  }
  (cpi->common).current_frame.frame_number = uVar21 + 1;
  cpi->ref_frame_flags = iVar4;
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    _Var3 = (cpi->refresh_frame).golden_frame;
    bVar22 = 1;
    lVar27 = 0x85a7;
    do {
      piVar20 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 8);
      if (((((lVar27 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
           (cpi->ppi->lap_enabled == 0)) &&
          (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
         ((cpi->ppi->use_svc == 0 && (piVar20 != (int *)0x0)))) {
        pRVar18 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
        if (piVar20[0x13c] == (pRVar18->buf).field_2.field_0.y_crop_width) {
          bVar29 = piVar20[0x13e] == (pRVar18->buf).field_3.field_0.y_crop_height;
        }
        else {
          bVar29 = false;
        }
        bVar22 = bVar29 | _Var3 & 1U;
      }
      if ((piVar20 != (int *)0x0) && ((lVar27 != 0x85aa || (bVar22 != 0)))) {
        *piVar20 = *piVar20 + -1;
        *(undefined8 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 8) =
             0;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 0x85ae);
  }
  return;
}

Assistant:

void av1_first_pass(AV1_COMP *cpi, const int64_t ts_duration) {
  MACROBLOCK *const x = &cpi->td.mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  CurrentFrame *const current_frame = &cm->current_frame;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int ref_frame_flags_backup = cpi->ref_frame_flags;
  cpi->ref_frame_flags = av1_ref_frame_flag_list[LAST_FRAME] |
                         av1_ref_frame_flag_list[GOLDEN_FRAME];

  // Detect if the key frame is screen content type.
  if (frame_is_intra_only(cm)) {
    FeatureFlags *const features = &cm->features;
    assert(cpi->source != NULL);
    xd->cur_buf = cpi->source;
    av1_set_screen_content_options(cpi, features);
  }

  // Prepare the speed features
  av1_set_speed_features_framesize_independent(cpi, cpi->oxcf.speed);

  // Unit size for the first pass encoding.
  const BLOCK_SIZE fp_block_size =
      get_fp_block_size(cpi->is_screen_content_type);

  int max_mb_rows = mi_params->mb_rows;
  int max_mb_cols = mi_params->mb_cols;
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_width) {
    int max_mi_cols = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_width);
    max_mb_cols = ROUND_POWER_OF_TWO(max_mi_cols, 2);
  }
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_height) {
    int max_mi_rows = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_height);
    max_mb_rows = ROUND_POWER_OF_TWO(max_mi_rows, 2);
  }

  // Number of rows in the unit size.
  // Note max_mb_rows and max_mb_cols are in the unit of 16x16.
  const int unit_rows = get_unit_rows(fp_block_size, max_mb_rows);
  const int unit_cols = get_unit_cols(fp_block_size, max_mb_cols);

  // Set fp_block_size, for the convenience of multi-thread usage.
  cpi->fp_block_size = fp_block_size;

  setup_firstpass_data(cm, &cpi->firstpass_data, unit_rows, unit_cols);
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list;
  FRAME_STATS *mb_stats = cpi->firstpass_data.mb_stats;

  // multi threading info
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;

  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  if (cpi->allocated_tiles < tile_cols * tile_rows) {
    av1_alloc_tile_data(cpi);
  }

  av1_init_tile_data(cpi);

  const YV12_BUFFER_CONFIG *last_frame = NULL;
  const YV12_BUFFER_CONFIG *golden_frame = NULL;
  if (!frame_is_intra_only(cm)) {
    av1_scale_references(cpi, EIGHTTAP_REGULAR, 0, 0);
    last_frame = av1_is_scaled(get_ref_scale_factors_const(cm, LAST_FRAME))
                     ? av1_get_scaled_ref_frame(cpi, LAST_FRAME)
                     : get_ref_frame_yv12_buf(cm, LAST_FRAME);
    golden_frame = av1_is_scaled(get_ref_scale_factors_const(cm, GOLDEN_FRAME))
                       ? av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME)
                       : get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }

  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;
  // First pass code requires valid last and new frame buffers.
  assert(this_frame != NULL);
  assert(frame_is_intra_only(cm) || (last_frame != NULL));

  av1_setup_frame_size(cpi);
  av1_set_mv_search_params(cpi);

  set_mi_offsets(mi_params, xd, 0, 0);
  xd->mi[0]->bsize = fp_block_size;

  // Do not use periodic key frames.
  cpi->rc.frames_to_key = INT_MAX;

  av1_set_quantizer(
      cm, cpi->oxcf.q_cfg.qm_minlevel, cpi->oxcf.q_cfg.qm_maxlevel, qindex,
      cpi->oxcf.q_cfg.enable_chroma_deltaq, cpi->oxcf.q_cfg.enable_hdr_deltaq,
      cpi->oxcf.mode == ALLINTRA, cpi->oxcf.tune_cfg.tuning);

  av1_setup_block_planes(xd, seq_params->subsampling_x,
                         seq_params->subsampling_y, num_planes);

  av1_setup_src_planes(x, cpi->source, 0, 0, num_planes, fp_block_size);
  av1_setup_dst_planes(xd->plane, seq_params->sb_size, this_frame, 0, 0, 0,
                       num_planes);

  if (!frame_is_intra_only(cm)) {
    av1_setup_pre_planes(xd, 0, last_frame, 0, 0, NULL, num_planes);
  }

  set_mi_offsets(mi_params, xd, 0, 0);

  // Don't store luma on the fist pass since chroma is not computed
  xd->cfl.store_y = 0;
  av1_frame_init_quantizer(cpi);

  av1_default_coef_probs(cm);
  av1_init_mode_probs(cm->fc);
  av1_init_mv_probs(cm);
  av1_initialize_rd_consts(cpi);

  enc_row_mt->sync_read_ptr = av1_row_mt_sync_read_dummy;
  enc_row_mt->sync_write_ptr = av1_row_mt_sync_write_dummy;

  if (mt_info->num_workers > 1) {
    enc_row_mt->sync_read_ptr = av1_row_mt_sync_read;
    enc_row_mt->sync_write_ptr = av1_row_mt_sync_write;
    av1_fp_encode_tiles_row_mt(cpi);
  } else {
    first_pass_tiles(cpi, fp_block_size);
  }

  FRAME_STATS stats = accumulate_frame_stats(mb_stats, unit_rows, unit_cols);
  int total_raw_motion_err_count =
      frame_is_intra_only(cm) ? 0 : unit_rows * unit_cols;
  const double raw_err_stdev =
      raw_motion_error_stdev(raw_motion_err_list, total_raw_motion_err_count);
  av1_free_firstpass_data(&cpi->firstpass_data);
  av1_dealloc_src_diff_buf(&cpi->td.mb, av1_num_planes(cm));

  // Clamp the image start to rows/2. This number of rows is discarded top
  // and bottom as dead data so rows / 2 means the frame is blank.
  if ((stats.image_data_start_row > unit_rows / 2) ||
      (stats.image_data_start_row == INVALID_ROW)) {
    stats.image_data_start_row = unit_rows / 2;
  }
  // Exclude any image dead zone
  if (stats.image_data_start_row > 0) {
    stats.intra_skip_count =
        AOMMAX(0, stats.intra_skip_count -
                      (stats.image_data_start_row * unit_cols * 2));
  }

  TWO_PASS *twopass = &cpi->ppi->twopass;
  const int num_mbs_16X16 = (cpi->oxcf.resize_cfg.resize_mode != RESIZE_NONE)
                                ? cpi->initial_mbs
                                : mi_params->MBs;
  // Number of actual units used in the first pass, it can be other square
  // block sizes than 16X16.
  const int num_mbs = get_num_mbs(fp_block_size, num_mbs_16X16);
  stats.intra_factor = stats.intra_factor / (double)num_mbs;
  stats.brightness_factor = stats.brightness_factor / (double)num_mbs;
  FIRSTPASS_STATS *this_frame_stats = twopass->stats_buf_ctx->stats_in_end;
  update_firstpass_stats(cpi, &stats, raw_err_stdev,
                         current_frame->frame_number, ts_duration,
                         fp_block_size);

  // Copy the previous Last Frame back into gf buffer if the prediction is good
  // enough... but also don't allow it to lag too far.
  if ((twopass->sr_update_lag > 3) ||
      ((current_frame->frame_number > 0) &&
       (this_frame_stats->pcnt_inter > 0.20) &&
       ((this_frame_stats->intra_error /
         DOUBLE_DIVIDE_CHECK(this_frame_stats->coded_error)) > 2.0))) {
    if (golden_frame != NULL) {
      assign_frame_buffer_p(
          &cm->ref_frame_map[get_ref_frame_map_idx(cm, GOLDEN_FRAME)],
          cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)]);
    }
    twopass->sr_update_lag = 1;
  } else {
    ++twopass->sr_update_lag;
  }

  aom_extend_frame_borders(this_frame, num_planes);

  // The frame we just compressed now becomes the last frame.
  assign_frame_buffer_p(
      &cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)], cm->cur_frame);

  // Special case for the first frame. Copy into the GF buffer as a second
  // reference.
  if (current_frame->frame_number == 0 &&
      get_ref_frame_map_idx(cm, GOLDEN_FRAME) != INVALID_IDX) {
    assign_frame_buffer_p(
        &cm->ref_frame_map[get_ref_frame_map_idx(cm, GOLDEN_FRAME)],
        cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)]);
  }

  print_reconstruction_frame(last_frame, current_frame->frame_number,
                             /*do_print=*/0);

  ++current_frame->frame_number;
  cpi->ref_frame_flags = ref_frame_flags_backup;
  if (!frame_is_intra_only(cm)) {
    release_scaled_references(cpi);
  }
}